

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

void __thiscall NaVector::cov(NaVector *this,NaVector *rVectY,NaVector *rVectMCF)

{
  int iVar1;
  double *pdVar2;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  NaReal fSum;
  NaReal fAvgY;
  NaReal fAvgX;
  int N;
  int t;
  int k;
  undefined8 local_40;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_24 = (**(code **)(*in_RDI + 0x30))();
  iVar1 = (**(code **)(*in_RSI + 0x30))();
  if (iVar1 < local_24) {
    local_24 = (**(code **)(*in_RSI + 0x30))();
  }
  if (local_24 != 0) {
    (**(code **)(*in_RDX + 0x20))(in_RDX,local_24 * 2 + -1);
    dVar3 = (double)(**(code **)(*in_RDI + 0x88))();
    dVar4 = (double)(**(code **)(*in_RSI + 0x88))();
    local_1c = -local_24;
    while (local_1c = local_1c + 1, local_1c < local_24) {
      local_40 = 0.0;
      if (local_1c < 0) {
        for (local_20 = 0; local_20 < local_24 - local_1c; local_20 = local_20 + 1) {
          dVar5 = (double)(**(code **)(*in_RSI + 0x50))
                                    (in_RSI,(long)local_20 % (long)local_24 & 0xffffffff);
          dVar6 = (double)(**(code **)(*in_RDI + 0x48))
                                    (in_RDI,(long)(local_20 - local_1c) % (long)local_24 &
                                            0xffffffff);
          local_40 = (dVar5 - dVar4) * (dVar6 - dVar3) + local_40;
        }
      }
      else {
        for (local_20 = 0; local_20 < local_24 + local_1c; local_20 = local_20 + 1) {
          dVar5 = (double)(**(code **)(*in_RDI + 0x48))
                                    (in_RDI,(long)local_20 % (long)local_24 & 0xffffffff);
          dVar6 = (double)(**(code **)(*in_RSI + 0x50))
                                    (in_RSI,(long)(local_20 + local_1c) % (long)local_24 &
                                            0xffffffff);
          local_40 = (dVar5 - dVar3) * (dVar6 - dVar4) + local_40;
        }
      }
      pdVar2 = (double *)(**(code **)(*in_RDX + 0x40))(in_RDX,local_1c + local_24 + -1);
      *pdVar2 = local_40 / (double)local_24;
    }
  }
  return;
}

Assistant:

void
NaVector::cov (const NaVector& rVectY, NaVector& rVectMCF) const
{
    int         k, t, N = (int)dim();

    if(N > (int)rVectY.dim())
        N = rVectY.dim();

    if(0 == N)
        return;

    rVectMCF.new_dim(2*N - 1);

    NaReal      fAvgX = average(), fAvgY = rVectY.average();

    // Compute MCF
    for(k = - N + 1; k < N; ++k){
        NaReal  fSum = 0;

        if(k < 0){
            for(t = 0; t < N - k; ++t){
                fSum += (rVectY(t % N) - fAvgY) * (get((t - k) % N) - fAvgX);
            }
        }else{// k >= 0
            for(t = 0; t < N + k; ++t){
                fSum += (get(t % N) - fAvgX) * (rVectY((t + k) % N) - fAvgY);
            }
        }
        rVectMCF[k + N - 1] = fSum / N;
    }
}